

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unbound_index.cpp
# Opt level: O2

void __thiscall
duckdb::UnboundIndex::UnboundIndex
          (UnboundIndex *this,
          unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *create_info
          ,IndexStorageInfo *storage_info_p,TableIOManager *table_io_manager,AttachedDatabase *db)

{
  pointer pCVar1;
  reference pvVar2;
  reference pvVar3;
  InternalException *this_00;
  ulong __n;
  ulong __n_00;
  allocator local_69;
  UnboundIndex *local_68;
  IndexStorageInfo *local_60;
  unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *local_58;
  string local_50;
  
  pCVar1 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     (create_info);
  Index::Index(&this->super_Index,
               (vector<unsigned_long,_true> *)
               &pCVar1[1].dependencies.set._M_h._M_rehash_policy._M_next_resize,table_io_manager,db)
  ;
  (this->super_Index)._vptr_Index = (_func_int **)&PTR__UnboundIndex_0177d718;
  local_58 = &this->create_info;
  (this->create_info).super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>
  ._M_t.super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
  super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl =
       (create_info->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
       ._M_t.super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
       _M_t.super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
       super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
  (create_info->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)._M_t
  .super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
  super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)0x0;
  local_60 = &this->storage_info;
  IndexStorageInfo::IndexStorageInfo(local_60,storage_info_p);
  __n = 0;
  local_68 = this;
  do {
    if ((ulong)((long)(local_68->storage_info).allocator_infos.
                      super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
                      .
                      super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_68->storage_info).allocator_infos.
                      super_vector<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
                      .
                      super__Vector_base<duckdb::FixedSizeAllocatorInfo,_std::allocator<duckdb::FixedSizeAllocatorInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 7) <= __n) {
      return;
    }
    pvVar2 = vector<duckdb::FixedSizeAllocatorInfo,_true>::get<true>
                       (&(this->storage_info).allocator_infos,__n);
    __n_00 = 0;
    while (__n_00 < (ulong)((long)(pvVar2->buffer_ids).
                                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)(pvVar2->buffer_ids).
                                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3)) {
      pvVar3 = vector<unsigned_long,_true>::get<true>(&pvVar2->buffer_ids,__n_00);
      __n_00 = __n_00 + 1;
      if (0x7ffffffffff080 < *pvVar3) {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_50,"Found invalid buffer ID in UnboundIndex constructor",
                   &local_69);
        InternalException::InternalException(this_00,&local_50);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    __n = __n + 1;
  } while( true );
}

Assistant:

UnboundIndex::UnboundIndex(unique_ptr<CreateInfo> create_info, IndexStorageInfo storage_info_p,
                           TableIOManager &table_io_manager, AttachedDatabase &db)
    : Index(create_info->Cast<CreateIndexInfo>().column_ids, table_io_manager, db), create_info(std::move(create_info)),
      storage_info(std::move(storage_info_p)) {

	// Memory safety check.
	for (idx_t info_idx = 0; info_idx < storage_info.allocator_infos.size(); info_idx++) {
		auto &info = storage_info.allocator_infos[info_idx];
		for (idx_t buffer_idx = 0; buffer_idx < info.buffer_ids.size(); buffer_idx++) {
			if (info.buffer_ids[buffer_idx] > idx_t(MAX_ROW_ID)) {
				throw InternalException("Found invalid buffer ID in UnboundIndex constructor");
			}
		}
	}
}